

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromMeshDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,double normalized_mesh_density)

{
  uchar uVar1;
  unsigned_short uVar2;
  bool bVar3;
  Context CVar4;
  bool bVar5;
  uchar uVar6;
  undefined8 uVar7;
  ON__UINT_PTR OVar8;
  ON_Terminator *pOVar9;
  ON_ProgressReporter *pOVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  double dVar15;
  
  dVar15 = ON_MeshParameters::ClampMeshDensityValue(normalized_mesh_density);
  if ((dVar15 < 0.0) || (1.0 < dVar15)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,0xf7f,"","Invalid normalized_mesh_density parameter.");
    dVar11 = Default.m_progress_reporter_interval.m_t[1];
    pOVar10 = Default.m_progress_reporter;
    pOVar9 = Default.m_terminator;
    dVar15 = Default.m_reserved7;
    OVar8 = Default.m_reserved6;
    uVar7 = Default._8_8_;
    uVar13 = Default._0_8_;
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] =
         Default.m_progress_reporter_interval.m_t[0];
    (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar11;
    __return_storage_ptr__->m_terminator = pOVar9;
    __return_storage_ptr__->m_progress_reporter = pOVar10;
    __return_storage_ptr__->m_reserved6 = OVar8;
    __return_storage_ptr__->m_reserved7 = dVar15;
    uVar12 = Default._0_8_;
    Default.m_bDisplayDensityIsAbsolute = SUB81(uVar13,0);
    Default.m_display_density = SUB81(uVar13,1);
    uVar1 = Default.m_display_density;
    Default.m_reserved = SUB82(uVar13,2);
    uVar2 = Default.m_reserved;
    Default.m_bControlNetMesh = SUB81(uVar13,4);
    bVar3 = Default.m_bControlNetMesh;
    Default.m_context = SUB81(uVar13,5);
    CVar4 = Default.m_context;
    Default.m_bComputeCurvature = SUB81(uVar13,6);
    bVar5 = Default.m_bComputeCurvature;
    Default.m_reserved3 = SUB81(uVar13,7);
    uVar6 = Default.m_reserved3;
    __return_storage_ptr__->m_bDisplayDensityIsAbsolute = Default.m_bDisplayDensityIsAbsolute;
    Default._0_8_ = uVar12;
    uVar13 = Default._8_8_;
    __return_storage_ptr__->m_display_density = uVar1;
    __return_storage_ptr__->m_reserved = uVar2;
    __return_storage_ptr__->m_bControlNetMesh = bVar3;
    __return_storage_ptr__->m_context = CVar4;
    __return_storage_ptr__->m_bComputeCurvature = bVar5;
    __return_storage_ptr__->m_reserved3 = uVar6;
    Default.m_reserved4 = (uint)uVar7;
    Default.m_reserved5 = SUB84(uVar7,4);
    uVar14 = Default.m_reserved5;
    __return_storage_ptr__->m_reserved4 = Default.m_reserved4;
    Default._8_8_ = uVar13;
    __return_storage_ptr__->m_reserved5 = uVar14;
    return __return_storage_ptr__;
  }
  if (dVar15 <= 2.3283064365386963e-10) {
    uVar14 = 1;
  }
  else if (dVar15 < 0.2) {
    uVar14 = 2;
  }
  else if (dVar15 < 0.35) {
    uVar14 = 3;
  }
  else {
    if (0.75 < dVar15) {
      uVar14 = 5;
      if ((dVar15 < 0.9999999997671694) || (dVar15 <= 1.0000000002328306)) goto LAB_0060c70a;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                 ,0xf78,"","Bug in some if condition in this function.");
    }
    uVar14 = 4;
  }
LAB_0060c70a:
  CreateFromDisplayDensity(__return_storage_ptr__,uVar14);
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromMeshDensity(
  double normalized_mesh_density
)
{
  normalized_mesh_density = ON_MeshParameters::ClampMeshDensityValue(normalized_mesh_density);

  if (normalized_mesh_density >= 0.0 && normalized_mesh_density <= 1.0)
  {
    unsigned int subd_display_density;

    if (normalized_mesh_density <= ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraCoarseDensity;
    else if (normalized_mesh_density < 0.20)
      subd_display_density = ON_SubDDisplayParameters::CoarseDensity;
    else if (normalized_mesh_density < 0.35)
      subd_display_density = ON_SubDDisplayParameters::MediumDensity;
    else if (normalized_mesh_density <= 0.75)
      subd_display_density = ON_SubDDisplayParameters::FineDensity;
    else if (normalized_mesh_density < 1.0 - ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraFineDensity;
    else if (normalized_mesh_density <= 1.0 + ON_ZERO_TOLERANCE)
      subd_display_density = ON_SubDDisplayParameters::ExtraFineDensity;
    else
    {
      ON_ERROR("Bug in some if condition in this function.");
      subd_display_density = ON_SubDDisplayParameters::DefaultDensity;
    }

    return ON_SubDDisplayParameters::CreateFromDisplayDensity(subd_display_density);
  }

  ON_ERROR("Invalid normalized_mesh_density parameter.");
  return ON_SubDDisplayParameters::Default;
}